

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_trap(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  trap_kind_conflict1 *ptVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint8_t attr;
  trap_kind *trap;
  wchar_t oid_local;
  _Bool cursor_local;
  wchar_t row_local;
  wchar_t col_local;
  
  ptVar1 = trap_info;
  c_prt(curs_attrs[1][(int)(uint)cursor],trap_info[oid].desc,row,col);
  if (tile_height == '\x01') {
    wVar2 = big_pad(L'A',row,trap_x_attr[3][ptVar1[oid].tidx],trap_x_char[3][ptVar1[oid].tidx]);
    wVar3 = big_pad(wVar2 + L'A',row,trap_x_attr[2][ptVar1[oid].tidx],
                    trap_x_char[2][ptVar1[oid].tidx]);
    wVar3 = wVar3 + wVar2 + L'A';
    wVar2 = big_pad(wVar3,row,trap_x_attr[1][ptVar1[oid].tidx],trap_x_char[1][ptVar1[oid].tidx]);
    big_pad(wVar2 + wVar3,row,trap_x_attr[0][ptVar1[oid].tidx],trap_x_char[0][ptVar1[oid].tidx]);
  }
  return;
}

Assistant:

static void display_trap(int col, int row, bool cursor, int oid )
{
	struct trap_kind *trap = &trap_info[oid];
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

	c_prt(attr, trap->desc, row, col);

	if (tile_height == 1) {
		/* Display symbols */
		col = 65;
		col += big_pad(col, row, trap_x_attr[LIGHTING_DARK][trap->tidx],
				trap_x_char[LIGHTING_DARK][trap->tidx]);
		col += big_pad(col, row, trap_x_attr[LIGHTING_LIT][trap->tidx],
				trap_x_char[LIGHTING_LIT][trap->tidx]);
		col += big_pad(col, row, trap_x_attr[LIGHTING_TORCH][trap->tidx],
				trap_x_char[LIGHTING_TORCH][trap->tidx]);
		(void) big_pad(col, row, trap_x_attr[LIGHTING_LOS][trap->tidx],
				trap_x_char[LIGHTING_LOS][trap->tidx]);
	}
}